

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

int __thiscall
ncnn::Layer::forward
          (Layer *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  size_type sVar2;
  const_reference __fn;
  reference pvVar3;
  int __flags;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  void *in_R8;
  bool bVar4;
  int i;
  Mat local_100;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar5;
  int iVar6;
  int local_8c;
  
  if ((*(byte *)((long)in_RDI + 9) & 1) == 0) {
    local_8c = -1;
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (in_RCX,(vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    iVar5 = 0;
    while( true ) {
      iVar6 = iVar5;
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX);
      __flags = (int)sVar2;
      if (__flags <= iVar5) break;
      __fn = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,(long)iVar6);
      Mat::clone(&local_100,(__fn *)__fn,
                 (in_RCX->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish,__flags,in_R8);
      pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)iVar6);
      if (pvVar3 != &local_100) {
        if (local_100.refcount != (int *)0x0) {
          LOCK();
          *local_100.refcount = *local_100.refcount + 1;
          UNLOCK();
        }
        if (pvVar3->refcount != (int *)0x0) {
          piVar1 = pvVar3->refcount;
          LOCK();
          iVar5 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (iVar5 == 1) {
            if (pvVar3->allocator == (Allocator *)0x0) {
              if (pvVar3->data != (void *)0x0) {
                free(pvVar3->data);
              }
            }
            else {
              (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
            }
          }
        }
        pvVar3->data = (void *)0x0;
        pvVar3->elemsize = 0;
        pvVar3->elempack = 0;
        pvVar3->dims = 0;
        pvVar3->w = 0;
        pvVar3->h = 0;
        pvVar3->d = 0;
        pvVar3->c = 0;
        pvVar3->cstep = 0;
        pvVar3->refcount = (int *)0x0;
        pvVar3->data = local_100.data;
        pvVar3->refcount = local_100.refcount;
        pvVar3->elemsize = local_100.elemsize;
        pvVar3->elempack = local_100.elempack;
        pvVar3->allocator = local_100.allocator;
        pvVar3->dims = local_100.dims;
        pvVar3->w = local_100.w;
        pvVar3->h = local_100.h;
        pvVar3->d = local_100.d;
        pvVar3->c = local_100.c;
        pvVar3->cstep = local_100.cstep;
      }
      if (local_100.refcount != (int *)0x0) {
        LOCK();
        iVar5 = *local_100.refcount;
        *local_100.refcount = *local_100.refcount + -1;
        UNLOCK();
        if (iVar5 == 1) {
          if (local_100.allocator == (Allocator *)0x0) {
            if (local_100.data != (void *)0x0) {
              free(local_100.data);
            }
          }
          else {
            (*(local_100.allocator)->_vptr_Allocator[3])(local_100.allocator,local_100.data);
          }
        }
      }
      local_100.data = (void *)0x0;
      local_100.elemsize = 0;
      local_100.elempack = 0;
      local_100.dims = 0;
      local_100.w = 0;
      local_100.h = 0;
      local_100.d = 0;
      local_100.c = 0;
      local_100.cstep = 0;
      local_100.refcount = (int *)0x0;
      pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)iVar6);
      bVar4 = true;
      if (pvVar3->data != (void *)0x0) {
        bVar4 = pvVar3->cstep * (long)pvVar3->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      iVar5 = iVar6 + 1;
    }
    local_8c = (**(code **)(*in_RDI + 0x40))(in_RDI,in_RDX,in_RCX);
  }
  return local_8c;
}

Assistant:

int Layer::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blobs = bottom_blobs;
    for (int i = 0; i < (int)top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blobs[i].clone(opt.blob_allocator);
        if (top_blobs[i].empty())
            return -100;
    }

    return forward_inplace(top_blobs, opt);
}